

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_announce(udp_tracker_connection *this)

{
  tracker_manager *ptVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint_type val;
  uint uVar4;
  tracker_request *this_00;
  pointer ppVar5;
  const_iterator puVar6;
  const_iterator puVar7;
  char *pcVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  element_type *peVar11;
  undefined8 uVar12;
  listen_socket_handle *plVar13;
  index_type iVar14;
  undefined1 *puVar15;
  error_code *in_R8;
  span<char> sVar16;
  string_view url;
  span<const_char> in;
  int local_57c;
  seconds32 local_578;
  int local_574;
  seconds32 local_570;
  undefined1 local_569;
  span<const_char> local_568;
  undefined1 local_551;
  span<const_char> local_550;
  aux *local_540;
  char *local_538;
  string local_530;
  undefined1 local_510 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  unsigned_long local_4f8;
  time_point local_4f0;
  size_t str_len;
  undefined1 local_4b0 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  undefined1 local_418 [8];
  error_code ec;
  string request_string;
  undefined1 local_3e0 [8];
  address ip;
  error_code ec_1;
  tracker_request *ptStack_3a8;
  address_v4 announce_ip;
  char *local_3a0;
  tracker_request *local_398;
  char *local_390;
  _Self local_388;
  address local_380;
  _Self local_360;
  iterator i;
  session_settings *settings;
  tracker_request *req;
  span<char> out;
  char buf [800];
  udp_tracker_connection *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    span<char>::span<char,800l>((span<char> *)&req,(char (*) [800])&out.m_len);
    this_00 = tracker_connection::tracker_req(&this->super_tracker_connection);
    i._M_node = (_Base_ptr)tracker_manager::settings((this->super_tracker_connection).m_man);
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_380,&this->m_target);
    local_360._M_node =
         (_Base_ptr)
         ::std::
         map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
         ::find((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                 *)m_connection_cache,&local_380);
    local_388._M_node =
         (_Base_ptr)
         ::std::
         map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
         ::end((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                *)m_connection_cache);
    bVar2 = ::std::operator==(&local_360,&local_388);
    if (!bVar2) {
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>
               ::operator->(&local_360);
      write_int64<long,char>((ppVar5->second).connection_id,(span<char> *)&req);
      write_int32<libtorrent::aux::udp_tracker_connection::action_t,char>
                (announce,(span<char> *)&req);
      write_int32<unsigned_int,char>(this->m_transaction_id,(span<char> *)&req);
      puVar6 = digest32<160L>::begin(&this_00->info_hash);
      puVar7 = digest32<160L>::end(&this_00->info_hash);
      pcVar8 = span<char>::data((span<char> *)&req);
      ::std::copy<unsigned_char_const*,char*>(puVar6,puVar7,pcVar8);
      sVar16 = span<char>::subspan((span<char> *)&req,0x14);
      local_398 = (tracker_request *)sVar16.m_ptr;
      req = local_398;
      local_390 = (char *)sVar16.m_len;
      out.m_ptr = local_390;
      puVar6 = digest32<160L>::begin(&this_00->pid);
      puVar7 = digest32<160L>::end(&this_00->pid);
      pcVar8 = span<char>::data((span<char> *)&req);
      ::std::copy<unsigned_char_const*,char*>(puVar6,puVar7,pcVar8);
      sVar16 = span<char>::subspan((span<char> *)&req,0x14);
      ptStack_3a8 = (tracker_request *)sVar16.m_ptr;
      req = ptStack_3a8;
      local_3a0 = (char *)sVar16.m_len;
      out.m_ptr = local_3a0;
      write_int64<long,char>(this_00->downloaded,(span<char> *)&req);
      write_int64<long,char>(this_00->left,(span<char> *)&req);
      write_int64<long,char>(this_00->uploaded,(span<char> *)&req);
      write_int32<libtorrent::event_t,char>(this_00->event,(span<char> *)&req);
      boost::asio::ip::address_v4::address_v4((address_v4 *)((long)&ec_1.cat_ + 4));
      bVar2 = session_settings::get_bool((session_settings *)i._M_node,0x8026);
      if (!bVar2) {
        session_settings::get_str_abi_cxx11_((session_settings *)i._M_node,1);
        uVar9 = ::std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          boost::system::error_code::error_code((error_code *)&ip.ipv6_address_.scope_id_);
          session_settings::get_str_abi_cxx11_((session_settings *)i._M_node,1);
          pcVar8 = (char *)::std::__cxx11::string::c_str();
          boost::asio::ip::make_address
                    ((address *)local_3e0,pcVar8,(error_code *)&ip.ipv6_address_.scope_id_);
          bVar2 = boost::system::error_code::operator_cast_to_bool
                            ((error_code *)&ip.ipv6_address_.scope_id_);
          if ((!bVar2) && (bVar2 = boost::asio::ip::address::is_v4((address *)local_3e0), bVar2)) {
            boost::asio::ip::address::to_v4((address *)((long)&request_string.field_2 + 0xc));
            boost::asio::ip::address_v4::operator=
                      ((address_v4 *)((long)&ec_1.cat_ + 4),
                       (address_v4 *)((long)&request_string.field_2 + 0xc));
          }
        }
      }
      val = boost::asio::ip::address_v4::to_uint((address_v4 *)((long)&ec_1.cat_ + 4));
      write_uint32<unsigned_int,char>(val,(span<char> *)&req);
      write_int32<unsigned_int,char>(this_00->key,(span<char> *)&req);
      write_int32<int,char>(this_00->num_want,(span<char> *)&req);
      write_uint16<unsigned_short,char>(this_00->listen_port,(span<char> *)&req);
      ::std::__cxx11::string::string((string *)&ec.cat_);
      boost::system::error_code::error_code((error_code *)local_418);
      local_4b0 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      url._M_len = local_4b0._8_8_;
      url._M_str = (char *)local_418;
      parse_url_components_abi_cxx11_(&local_4a0,local_4b0._0_8_,url,in_R8);
      puVar15 = &::std::ignore;
      ::std::
      tie<std::_Swallow_assign_const,std::_Swallow_assign_const,std::_Swallow_assign_const,std::_Swallow_assign_const,std::__cxx11::string>
                ((tuple<const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&str_len,(_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore,
                 (_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec.cat_);
      ::std::
      tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&>
      ::operator=((tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&>
                   *)&str_len,&local_4a0);
      ::std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple(&local_4a0);
      bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_418);
      if (bVar2) {
        ::std::__cxx11::string::clear();
      }
      uVar9 = ::std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        local_4f8 = ::std::__cxx11::string::size();
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xff;
        puVar10 = ::std::min<unsigned_long>
                            (&stack0xfffffffffffffb08,
                             (unsigned_long *)
                             &cb.
                              super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
        local_4f0.__d.__r = (duration)*puVar10;
        ::std::__cxx11::string::resize((ulong)&ec.cat_);
        write_uint8<int,char>(2,(span<char> *)&req);
        write_uint8<unsigned_long,char>((unsigned_long)local_4f0.__d.__r,(span<char> *)&req);
        write_string<char>((string *)&ec.cat_,(span<char> *)&req);
      }
      tracker_connection::requester((tracker_connection *)local_510);
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_510);
      if (bVar2) {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_510);
        uVar4 = (*peVar11->_vptr_request_callback[6])();
        if ((uVar4 & 1) != 0) {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_510);
          span<char_const>::span<libtorrent::digest32<160l>,char,void>
                    ((span<char_const> *)&local_540,&this_00->info_hash);
          in.m_len = (difference_type)puVar15;
          in.m_ptr = local_538;
          to_hex_abi_cxx11_(&local_530,local_540,in);
          uVar12 = ::std::__cxx11::string::c_str();
          (*peVar11->_vptr_request_callback[7])(peVar11,"==> UDP_TRACKER_ANNOUNCE [%s]",uVar12);
          ::std::__cxx11::string::~string((string *)&local_530);
        }
      }
      uVar9 = ::std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        ptVar1 = (this->super_tracker_connection).m_man;
        plVar13 = tracker_connection::bind_socket(&this->super_tracker_connection);
        pcVar8 = (char *)::std::__cxx11::string::c_str();
        uVar3 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_target);
        iVar14 = span<char>::size((span<char> *)&req);
        span<const_char>::span(&local_550,(char *)&out.m_len,800 - iVar14);
        local_551 = 2;
        tracker_manager::send_hostname
                  (ptVar1,plVar13,pcVar8,(uint)uVar3,local_550,(error_code *)local_418,
                   (udp_send_flags_t)0x2);
      }
      else {
        ptVar1 = (this->super_tracker_connection).m_man;
        plVar13 = tracker_connection::bind_socket(&this->super_tracker_connection);
        iVar14 = span<char>::size((span<char> *)&req);
        span<const_char>::span(&local_568,(char *)&out.m_len,800 - iVar14);
        local_569 = 2;
        tracker_manager::send
                  (ptVar1,(int)plVar13,&this->m_target,(size_t)local_568.m_ptr,(int)local_568.m_len)
        ;
      }
      this->m_state = announce;
      iVar14 = span<char>::size((span<char> *)&req);
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x33c - (int)iVar14);
      this->m_attempts = this->m_attempts + 1;
      bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_418);
      if (bVar2) {
        local_574 = 0;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_570,&local_574);
        local_57c = 0x1e;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_578,&local_57c);
        fail(this,(error_code *)local_418,sock_write,"",local_570,local_578);
      }
      ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
                ((shared_ptr<libtorrent::aux::request_callback> *)local_510);
      ::std::__cxx11::string::~string((string *)&ec.cat_);
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_announce()
	{
		if (m_abort) return;

		char buf[800];
		span<char> out = buf;

		tracker_request const& req = tracker_req();
		aux::session_settings const& settings = m_man.settings();

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		aux::write_int64(i->second.connection_id, out); // connection_id
		aux::write_int32(action_t::announce, out); // action (announce)
		aux::write_int32(m_transaction_id, out); // transaction_id
		std::copy(req.info_hash.begin(), req.info_hash.end(), out.data()); // info_hash
		out = out.subspan(20);
		std::copy(req.pid.begin(), req.pid.end(), out.data()); // peer_id
		out = out.subspan(20);
		aux::write_int64(req.downloaded, out); // downloaded
		aux::write_int64(req.left, out); // left
		aux::write_int64(req.uploaded, out); // uploaded
		aux::write_int32(req.event, out); // event
		// ip address
		address_v4 announce_ip;

		if (!settings.get_bool(settings_pack::anonymous_mode)
			&& !settings.get_str(settings_pack::announce_ip).empty())
		{
			error_code ec;
			address ip = make_address(settings.get_str(settings_pack::announce_ip).c_str(), ec);
			if (!ec && ip.is_v4()) announce_ip = ip.to_v4();
		}
		aux::write_uint32(announce_ip.to_uint(), out);
		aux::write_int32(req.key, out); // key
		aux::write_int32(req.num_want, out); // num_want
		aux::write_uint16(req.listen_port, out); // port

		std::string request_string;
		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, request_string)
			= parse_url_components(req.url, ec);
		if (ec) request_string.clear();

		if (!request_string.empty())
		{
			std::size_t str_len = std::min(request_string.size(), std::size_t(255));
			request_string.resize(str_len);

			aux::write_uint8(2, out);
			aux::write_uint8(str_len, out);
			aux::write_string(request_string, out);
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_ANNOUNCE [%s]", aux::to_hex(req.info_hash).c_str());
		}
#endif

		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::announce;
		sent_bytes(int(sizeof(buf)) - int(out.size()) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}